

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

optional<pbrt::BSDFSample> * __thiscall
pbrt::HairBxDF::Sample_f
          (HairBxDF *this,Vector3f wo,Float uc,Point2f u,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Vector3f wi_00;
  span<const_float> weights;
  Vector3f wi_01;
  Vector3f wo_00;
  BxDFFlags flags;
  float *pfVar4;
  undefined4 in_ECX;
  float in_EDX;
  HairBxDF *in_RSI;
  int __x;
  optional<pbrt::BSDFSample> *in_RDI;
  undefined8 *puVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Float FVar9;
  double dVar10;
  double dVar11;
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [56];
  undefined1 auVar12 [64];
  float in_XMM1_Da;
  undefined1 auVar15 [64];
  float in_XMM2_Da;
  undefined1 in_ZMM3 [64];
  array<float,_4> aVar18;
  SampledSpectrum SVar19;
  Float cosThetap_o_1;
  Float sinThetap_o_1;
  int p_1;
  Float pdf;
  Vector3f wi;
  Float phi_i;
  Float dphi;
  Float gamma_t;
  Float cosGamma_t;
  Float sinGamma_t;
  Float etap;
  Float cosTheta_i;
  Float sinTheta_i;
  Float cosPhi;
  Float sinTheta;
  Float cosTheta;
  Float cosThetap_o;
  Float sinThetap_o;
  int p;
  array<float,_4> apPDF;
  Float gamma_o;
  Float phi_o;
  Float cosTheta_o;
  Float sinTheta_o;
  float in_stack_fffffffffffffe48;
  float in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  Float in_stack_fffffffffffffe54;
  Float in_stack_fffffffffffffe58;
  float gamma_o_00;
  Float in_stack_fffffffffffffe5c;
  Float in_stack_fffffffffffffe60;
  float fVar20;
  Float in_stack_fffffffffffffe64;
  Float in_stack_fffffffffffffe6c;
  float cosTheta_o_00;
  float cosTheta_i_00;
  Float in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  size_t in_stack_fffffffffffffea8;
  Float in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  uint local_c4;
  float local_c0;
  undefined8 local_bc;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  int local_78;
  int local_68;
  float mode_00;
  float fVar21;
  float fVar22;
  Tuple2<pbrt::Point2,_float> local_30;
  ulong uVar23;
  float fVar24;
  float local_18;
  undefined1 auVar13 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [56];
  
  uVar1 = vmovlpd_avx(in_ZMM0._0_16_);
  local_30 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM3._0_16_);
  local_18 = (float)uVar1;
  uVar23 = uVar1;
  fVar24 = in_XMM1_Da;
  Sqr<float>(local_18);
  fVar6 = SafeSqrt(0.0);
  auVar17 = (undefined1  [56])0x0;
  dVar10 = std::atan2((double)(ulong)(uint)in_XMM1_Da,(double)(uVar1 >> 0x20));
  fVar7 = SafeASin(0.0);
  auVar14 = (undefined1  [56])0x0;
  aVar18 = ApPDF((HairBxDF *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff2c);
  auVar15._0_8_ = aVar18.values._8_8_;
  auVar15._8_56_ = auVar17;
  auVar12._0_8_ = aVar18.values._0_8_;
  auVar12._8_56_ = auVar14;
  uVar2 = vmovlpd_avx(auVar12._0_16_);
  mode_00 = (float)uVar2;
  fVar21 = (float)((ulong)uVar2 >> 0x20);
  uVar2 = vmovlpd_avx(auVar15._0_16_);
  fVar22 = (float)uVar2;
  pstd::span<float_const>::span<pstd::array<float,4>,void,pstd::array<float,4>>
            ((span<const_float> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (array<float,_4> *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  weights.ptr._4_4_ = in_stack_fffffffffffffea4;
  weights.ptr._0_4_ = in_stack_fffffffffffffea0;
  weights.n = in_stack_fffffffffffffea8;
  local_68 = SampleDiscrete(weights,in_stack_fffffffffffffe9c,&in_RSI->h,(Float *)in_RDI);
  if (local_68 == 0) {
    local_80 = fVar6 * in_RSI->cos2kAlpha[1] + local_18 * in_RSI->sin2kAlpha[1];
    local_7c = local_18 * in_RSI->cos2kAlpha[1] - fVar6 * in_RSI->sin2kAlpha[1];
  }
  else if (local_68 == 1) {
    local_80 = fVar6 * in_RSI->cos2kAlpha[0] - local_18 * in_RSI->sin2kAlpha[0];
    local_7c = local_18 * in_RSI->cos2kAlpha[0] + fVar6 * in_RSI->sin2kAlpha[0];
  }
  else {
    local_80 = fVar6;
    local_7c = local_18;
    if (local_68 == 2) {
      local_80 = fVar6 * in_RSI->cos2kAlpha[2] - local_18 * in_RSI->sin2kAlpha[2];
      local_7c = local_18 * in_RSI->cos2kAlpha[2] + fVar6 * in_RSI->sin2kAlpha[2];
    }
  }
  std::abs(local_78);
  fVar20 = in_RSI->v[local_68];
  pfVar4 = Tuple2<pbrt::Point2,_float>::operator[](&local_30,0);
  local_88 = 1e-05;
  pfVar4 = std::max<float>(pfVar4,&local_88);
  cosTheta_i_00 = *pfVar4;
  pfVar4 = Tuple2<pbrt::Point2,_float>::operator[](&local_30,0);
  cosTheta_o_00 = 1.0 - *pfVar4;
  fVar8 = FastExp(in_stack_fffffffffffffe60);
  dVar11 = std::log((double)(ulong)(uint)(cosTheta_i_00 + cosTheta_o_00 * fVar8));
  local_84 = fVar20 * SUB84(dVar11,0) + 1.0;
  Sqr<float>(local_84);
  local_8c = SafeSqrt(0.0);
  pfVar4 = Tuple2<pbrt::Point2,_float>::operator[](&local_30,1);
  dVar11 = std::cos((double)(ulong)(uint)(*pfVar4 * 6.2831855));
  local_90 = SUB84(dVar11,0);
  local_94 = -local_84 * local_7c + local_8c * local_90 * local_80;
  Sqr<float>(local_94);
  local_98 = SafeSqrt(0.0);
  Sqr<float>(in_RSI->eta);
  Sqr<float>(local_18);
  local_9c = SafeSqrt(0.0);
  local_9c = local_9c / fVar6;
  local_a0 = in_RSI->h / local_9c;
  Sqr<float>(local_a0);
  local_a4 = SafeSqrt(0.0);
  local_a8 = SafeASin(0.0);
  if (local_68 < 3) {
    in_stack_fffffffffffffe6c = Phi(local_68,fVar7,local_a8);
    FVar9 = SampleTrimmedLogistic
                      (in_stack_fffffffffffffe64,in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c
                       ,in_stack_fffffffffffffe58);
    local_ac = in_stack_fffffffffffffe6c + FVar9;
  }
  else {
    local_ac = in_XMM2_Da * 6.2831855;
  }
  local_b0 = SUB84(dVar10,0) + local_ac;
  fVar7 = local_98;
  fVar8 = local_94;
  dVar10 = std::cos((double)(ulong)(uint)local_b0);
  fVar6 = fVar7 * SUB84(dVar10,0);
  fVar20 = local_98;
  std::sin((double)(ulong)(uint)local_b0);
  puVar5 = &local_bc;
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,0.0);
  local_c0 = 0.0;
  for (local_c4 = 0; __x = (int)puVar5, (int)local_c4 < 3; local_c4 = local_c4 + 1) {
    std::abs(__x);
    std::abs(__x);
    in_stack_fffffffffffffe54 =
         Mp(cosTheta_i_00,cosTheta_o_00,in_stack_fffffffffffffe6c,fVar8,fVar6);
    pfVar4 = pstd::array<float,_4>::operator[]
                       ((array<float,_4> *)&stack0xffffffffffffff9c,(long)(int)local_c4);
    gamma_o_00 = in_stack_fffffffffffffe54 * *pfVar4;
    puVar5 = (undefined8 *)(ulong)local_c4;
    FVar9 = Np(fVar6,(int)fVar20,fVar7,gamma_o_00,in_stack_fffffffffffffe54);
    local_c0 = gamma_o_00 * FVar9 + local_c0;
  }
  FVar9 = Mp(cosTheta_i_00,cosTheta_o_00,in_stack_fffffffffffffe6c,fVar8,fVar6);
  pfVar4 = pstd::array<float,_4>::operator[]((array<float,_4> *)&stack0xffffffffffffff9c,3);
  local_c0 = local_c0 + FVar9 * *pfVar4 * 0.15915494;
  auVar14 = ZEXT856(0);
  auVar17 = (undefined1  [56])0x0;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar24;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar23;
  wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar23 >> 0x20);
  wi_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_ECX;
  wi_01.super_Tuple3<pbrt::Vector3,_float>.x = local_18;
  wi_01.super_Tuple3<pbrt::Vector3,_float>.z = in_EDX;
  SVar19 = f((HairBxDF *)CONCAT44(fVar22,fVar21),wo_00,wi_01,(TransportMode)mode_00);
  auVar16._0_8_ = SVar19.values.values._8_8_;
  auVar16._8_56_ = auVar17;
  auVar13._0_8_ = SVar19.values.values._0_8_;
  auVar13._8_56_ = auVar14;
  uVar2 = vmovlpd_avx(auVar13._0_16_);
  uVar3 = vmovlpd_avx(auVar16._0_16_);
  flags = Flags(in_RSI);
  SVar19.values.values[2] = (float)(int)uVar3;
  SVar19.values.values[3] = (float)(int)((ulong)uVar3 >> 0x20);
  SVar19.values.values[0] = (float)(int)uVar2;
  SVar19.values.values[1] = (float)(int)((ulong)uVar2 >> 0x20);
  wi_00.super_Tuple3<pbrt::Vector3,_float>.z = local_b4;
  wi_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_bc;
  wi_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)local_bc >> 0x20);
  BSDFSample::BSDFSample
            ((BSDFSample *)&stack0xffffffffffffff08,SVar19,wi_00,local_c0,flags,1.0,false);
  pstd::optional<pbrt::BSDFSample>::optional
            ((optional<pbrt::BSDFSample> *)CONCAT44(in_stack_fffffffffffffe54,local_c0),
             (BSDFSample *)CONCAT44(FVar9,in_stack_fffffffffffffe48));
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU pstd::optional<BSDFSample> HairBxDF::Sample_f(Vector3f wo, Float uc, Point2f u,
                                              TransportMode mode,
                                              BxDFReflTransFlags sampleFlags) const {
    // Compute hair coordinate system terms related to _wo_
    Float sinTheta_o = wo.x;
    Float cosTheta_o = SafeSqrt(1 - Sqr(sinTheta_o));
    Float phi_o = std::atan2(wo.z, wo.y);
    Float gamma_o = SafeASin(h);

    // Determine which term $p$ to sample for hair scattering
    pstd::array<Float, pMax + 1> apPDF = ApPDF(cosTheta_o);
    int p = SampleDiscrete(apPDF, uc, nullptr, &uc);

    // Compute $\sin\,\thetao$ and $\cos\,\thetao$ terms accounting for scales
    Float sinThetap_o, cosThetap_o;
    if (p == 0) {
        sinThetap_o = sinTheta_o * cos2kAlpha[1] - cosTheta_o * sin2kAlpha[1];
        cosThetap_o = cosTheta_o * cos2kAlpha[1] + sinTheta_o * sin2kAlpha[1];
    }
    // Handle remainder of $p$ values for hair scale tilt
    else if (p == 1) {
        sinThetap_o = sinTheta_o * cos2kAlpha[0] + cosTheta_o * sin2kAlpha[0];
        cosThetap_o = cosTheta_o * cos2kAlpha[0] - sinTheta_o * sin2kAlpha[0];
    } else if (p == 2) {
        sinThetap_o = sinTheta_o * cos2kAlpha[2] + cosTheta_o * sin2kAlpha[2];
        cosThetap_o = cosTheta_o * cos2kAlpha[2] - sinTheta_o * sin2kAlpha[2];
    } else {
        sinThetap_o = sinTheta_o;
        cosThetap_o = cosTheta_o;
    }

    // Handle out-of-range $\cos\,\thetao$ from scale adjustment
    cosThetap_o = std::abs(cosThetap_o);

    // Sample $M_p$ to compute $\thetai$
    Float cosTheta = 1 + v[p] * std::log(std::max<Float>(u[0], 1e-5) +
                                         (1 - u[0]) * FastExp(-2 / v[p]));
    Float sinTheta = SafeSqrt(1 - Sqr(cosTheta));
    Float cosPhi = std::cos(2 * Pi * u[1]);
    Float sinTheta_i = -cosTheta * sinThetap_o + sinTheta * cosPhi * cosThetap_o;
    Float cosTheta_i = SafeSqrt(1 - Sqr(sinTheta_i));

    // Sample $N_p$ to compute $\Delta\phi$
    // Compute $\gammat$ for refracted ray
    Float etap = SafeSqrt(Sqr(eta) - Sqr(sinTheta_o)) / cosTheta_o;
    Float sinGamma_t = h / etap;
    Float cosGamma_t = SafeSqrt(1 - Sqr(sinGamma_t));
    Float gamma_t = SafeASin(sinGamma_t);

    Float dphi;
    if (p < pMax)
        dphi = Phi(p, gamma_o, gamma_t) + SampleTrimmedLogistic(uc, s, -Pi, Pi);
    else
        dphi = 2 * Pi * uc;

    // Compute _wi_ from sampled hair scattering angles
    Float phi_i = phi_o + dphi;
    Vector3f wi(sinTheta_i, cosTheta_i * std::cos(phi_i), cosTheta_i * std::sin(phi_i));

    // Compute PDF for sampled hair scattering direction _wi_
    Float pdf = 0;
    for (int p = 0; p < pMax; ++p) {
        // Compute $\sin\,\thetao$ and $\cos\,\thetao$ terms accounting for scales
        Float sinThetap_o, cosThetap_o;
        if (p == 0) {
            sinThetap_o = sinTheta_o * cos2kAlpha[1] - cosTheta_o * sin2kAlpha[1];
            cosThetap_o = cosTheta_o * cos2kAlpha[1] + sinTheta_o * sin2kAlpha[1];
        }
        // Handle remainder of $p$ values for hair scale tilt
        else if (p == 1) {
            sinThetap_o = sinTheta_o * cos2kAlpha[0] + cosTheta_o * sin2kAlpha[0];
            cosThetap_o = cosTheta_o * cos2kAlpha[0] - sinTheta_o * sin2kAlpha[0];
        } else if (p == 2) {
            sinThetap_o = sinTheta_o * cos2kAlpha[2] + cosTheta_o * sin2kAlpha[2];
            cosThetap_o = cosTheta_o * cos2kAlpha[2] - sinTheta_o * sin2kAlpha[2];
        } else {
            sinThetap_o = sinTheta_o;
            cosThetap_o = cosTheta_o;
        }

        // Handle out-of-range $\cos\,\thetao$ from scale adjustment
        cosThetap_o = std::abs(cosThetap_o);

        // Handle out-of-range $\cos\,\thetao$ from scale adjustment
        cosThetap_o = std::abs(cosThetap_o);

        pdf += Mp(cosTheta_i, cosThetap_o, sinTheta_i, sinThetap_o, v[p]) * apPDF[p] *
               Np(dphi, p, s, gamma_o, gamma_t);
    }
    pdf += Mp(cosTheta_i, cosTheta_o, sinTheta_i, sinTheta_o, v[pMax]) * apPDF[pMax] *
           (1 / (2 * Pi));

    return BSDFSample(f(wo, wi, mode), wi, pdf, Flags());
}